

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::update_screen(PathTracer *this)

{
  ulong uVar1;
  ulong uVar2;
  reference pvVar3;
  PathTracer *this_local;
  
  switch(this->state) {
  case INIT:
  case READY:
    break;
  case VISUALIZE:
    visualize_accel(this);
    break;
  case RENDERING:
    uVar1 = (this->frameBuffer).w;
    uVar2 = (this->frameBuffer).h;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->frameBuffer).data,0);
    glDrawPixels(uVar1 & 0xffffffff,uVar2 & 0xffffffff,0x1908,0x1401,pvVar3);
    break;
  case DONE:
    uVar1 = (this->frameBuffer).w;
    uVar2 = (this->frameBuffer).h;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->frameBuffer).data,0);
    glDrawPixels(uVar1 & 0xffffffff,uVar2 & 0xffffffff,0x1908,0x1401,pvVar3);
  }
  return;
}

Assistant:

void PathTracer::update_screen() {
    switch (state) {
      case INIT:
      case READY:
        break;
      case VISUALIZE:
        visualize_accel();
        break;
      case RENDERING:
        glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
            GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
        break;
      case DONE:
        //sampleBuffer.tonemap(frameBuffer, tm_gamma, tm_level, tm_key, tm_wht);
        glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
            GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
        break;
    }
  }